

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O0

bool Assimp::MDL::HalfLife::HL1MDLLoader::get_num_blend_controllers
               (int num_blend_animations,int *num_blend_controllers)

{
  Logger *this;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int *local_18;
  int *num_blend_controllers_local;
  int num_blend_animations_local;
  
  if (num_blend_animations == 1) {
    *num_blend_controllers = 0;
    num_blend_controllers_local._7_1_ = true;
  }
  else if (num_blend_animations == 2) {
    *num_blend_controllers = 1;
    num_blend_controllers_local._7_1_ = true;
  }
  else if (num_blend_animations == 4) {
    *num_blend_controllers = 2;
    num_blend_controllers_local._7_1_ = true;
  }
  else {
    *num_blend_controllers = 0;
    local_18 = num_blend_controllers;
    num_blend_controllers_local._0_4_ = num_blend_animations;
    this = DefaultLogger::get();
    std::__cxx11::to_string(&local_78,(int)num_blend_controllers_local);
    std::operator+(&local_58,"[Half-Life 1 MDL] Unsupported number of blend animations (",&local_78)
    ;
    std::operator+(&local_38,&local_58,")");
    Logger::warn(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    num_blend_controllers_local._7_1_ = false;
  }
  return num_blend_controllers_local._7_1_;
}

Assistant:

bool HL1MDLLoader::get_num_blend_controllers(const int num_blend_animations, int &num_blend_controllers) {

    switch (num_blend_animations) {
        case SequenceBlendMode_HL1::NoBlend:
            num_blend_controllers = 0;
            return true;
        case SequenceBlendMode_HL1::TwoWayBlending:
            num_blend_controllers = 1;
            return true;
        case SequenceBlendMode_HL1::FourWayBlending:
            num_blend_controllers = 2;
            return true;
        default:
            num_blend_controllers = 0;
            ASSIMP_LOG_WARN(MDL_HALFLIFE_LOG_HEADER "Unsupported number of blend animations (" + std::to_string(num_blend_animations) + ")");
            return false;
    }
}